

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_byte(lua_State *L)

{
  StkId pTVar1;
  size_t in_RAX;
  char *pcVar2;
  lua_Integer lVar3;
  ulong uVar4;
  ulong uVar5;
  uint space;
  size_t l;
  
  l = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&l);
  lVar3 = luaL_optinteger(L,2,1);
  uVar5 = (lVar3 >> 0x3f & l + 1) + lVar3;
  space = 0;
  uVar4 = 0;
  if (0 < (long)uVar5) {
    uVar4 = uVar5;
  }
  lVar3 = luaL_optinteger(L,3,uVar4);
  uVar4 = (lVar3 >> 0x3f & l + 1) + lVar3;
  if ((long)uVar4 < 1) {
    uVar4 = 0;
  }
  if ((long)uVar5 < 2) {
    uVar5 = 1;
  }
  if (l <= uVar4) {
    uVar4 = l;
  }
  if (uVar5 <= uVar4) {
    space = ((int)uVar4 - (int)uVar5) + 1;
    if ((long)((long)(int)space + uVar5) <= (long)uVar4) {
      luaL_error(L,"string slice too long");
    }
    luaL_checkstack(L,space,"string slice too long");
    for (uVar4 = 0; space != uVar4; uVar4 = uVar4 + 1) {
      pTVar1 = L->top;
      (pTVar1->value).n = (double)(byte)pcVar2[uVar4 + (uVar5 - 1)];
      pTVar1->tt = 3;
      L->top = L->top + 1;
    }
  }
  return space;
}

Assistant:

static int str_byte(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
ptrdiff_t posi=posrelat(luaL_optinteger(L,2,1),l);
ptrdiff_t pose=posrelat(luaL_optinteger(L,3,posi),l);
int n,i;
if(posi<=0)posi=1;
if((size_t)pose>l)pose=l;
if(posi>pose)return 0;
n=(int)(pose-posi+1);
if(posi+n<=pose)
luaL_error(L,"string slice too long");
luaL_checkstack(L,n,"string slice too long");
for(i=0;i<n;i++)
lua_pushinteger(L,uchar(s[posi+i-1]));
return n;
}